

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O1

void __thiscall SAT::cEnqueue(SAT *this,Lit p,Reason r)

{
  char cVar1;
  Lit LVar2;
  Clause *pCVar3;
  uint uVar4;
  char cVar5;
  Lit local_14;
  anon_union_8_2_743a5d44_for_Reason_0 local_10;
  
  LVar2.x = ::lit_False.x;
  uVar4 = p.x >> 1;
  cVar1 = (this->assigns).data[uVar4];
  cVar5 = -cVar1;
  if ((p.x & 1U) == 0) {
    cVar5 = cVar1;
  }
  local_14.x = p.x;
  local_10 = r.field_0;
  if (cVar5 != ::l_False.value) {
    (this->assigns).data[uVar4] = -((byte)p.x & 1) | 1;
    (this->trailpos).data[uVar4] = engine.trail.sz;
    (this->reason).data[uVar4].field_0 = r.field_0;
    vec<Lit>::push((this->trail).data + ((this->trail).sz - 1),&local_14);
    return;
  }
  if ((so.lazy) && (r.field_0 != (Clause *)0x0)) {
    pCVar3 = getConfl(this,(Reason *)&local_10,p);
    this->confl = pCVar3;
    if (0xff < *(uint *)pCVar3) {
      pCVar3->data[0].x = local_14.x;
      return;
    }
  }
  else {
    pCVar3 = this->short_confl;
    uVar4 = *(uint *)pCVar3;
    if ((0xff < uVar4) && (pCVar3->data[0].x = ::lit_False.x, 0x1ff < uVar4)) {
      *(int *)(pCVar3 + 1) = LVar2.x;
      this->confl = pCVar3;
      return;
    }
  }
  abort();
}

Assistant:

void SAT::cEnqueue(Lit p, Reason r) {
	/* if (so.debug) { */
	/*   std::cerr << "c-enqueue literal " << getLitString(toInt(p)) << " because " << showReason(r)
	 * << "\n"; */
	/* } */
	assert(value(p) != l_True);
	const int v = var(p);
	if (value(p) == l_False) {
		if (so.lazy) {
			if (r == nullptr) {
				assert(decisionLevel() == 0);
				setConfl();
			} else {
				confl = getConfl(r, p);
				(*confl)[0] = p;
			}
		} else {
			setConfl();
		}
		return;
	}
	assigns[v] = toInt(lbool(!sign(p)));
	trailpos[v] = engine.trailPos();
	reason[v] = r;
	trail.last().push(p);
}